

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O2

bool soul::Optimisations::isReachableFrom(Function *f,Block *dest,Block *source)

{
  bool result;
  undefined1 local_29;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = &local_29;
  local_29 = 0;
  local_10 = std::
             _Function_handler<bool_(soul::heart::Block_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/heart/soul_heart_Optimisations.h:349:13)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(soul::heart::Block_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/heart/soul_heart_Optimisations.h:349:13)>
             ::_M_manager;
  local_28._M_unused._M_object = source;
  CallFlowGraph::visitUpstreamBlocks(f,dest,(function<bool_(soul::heart::Block_&)> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return (bool)local_29;
}

Assistant:

static bool isReachableFrom (heart::Function& f, heart::Block& dest, heart::Block& source)
    {
        bool result = false;

        CallFlowGraph::visitUpstreamBlocks (f, dest,
            [&] (heart::Block& b) -> bool
            {
                if (std::addressof (b) == std::addressof (source)) { result = true; return false; }
                return true;
            });

        return result;
    }